

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall llama_vocab::impl::print_info(impl *this)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  size_type sVar4;
  uint *puVar5;
  long in_RDI;
  int *id;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar6;
  uint in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  _Self local_50;
  _Self local_48;
  long local_40;
  impl *in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  type_name_abi_cxx11_(in_stack_ffffffffffffffc8);
  uVar3 = ::std::__cxx11::string::c_str();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab type       = %s\n","print_info",uVar3);
  ::std::__cxx11::string::~string(local_28);
  uVar2 = llama_vocab::n_tokens((llama_vocab *)0x53bb65);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_vocab          = %u\n","print_info",(ulong)uVar2);
  sVar4 = std::
          unordered_map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_llama_vocab::impl::pair_hash,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
          ::size((unordered_map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_llama_vocab::impl::pair_hash,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                  *)0x53bb92);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_merges         = %u\n","print_info",
                     sVar4 & 0xffffffff);
  if (*(int *)(in_RDI + 0x10) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x10);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x10));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: BOS token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x14) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x14);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x14));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOS token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x18) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x18);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x18));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOT token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x1c) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x1c);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x1c));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOM token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x20) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x20);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x20));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: UNK token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x24) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x24);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x24));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: SEP token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x28) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x28);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x28));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: PAD token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x2c) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x2c);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x2c));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: MASK token       = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x30) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x30);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x30));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: LF token         = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x34) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x34);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x34));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM PRE token    = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x38) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x38);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x38));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM SUF token    = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x3c) != -1) {
    uVar6 = *(uint *)(in_RDI + 0x3c);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x3c));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM MID token    = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
  }
  if (*(int *)(in_RDI + 0x40) != -1) {
    in_stack_ffffffffffffff64 = *(uint *)(in_RDI + 0x40);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x40));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM PAD token    = %d \'%s\'\n","print_info",
                       (ulong)in_stack_ffffffffffffff64,uVar3);
  }
  if (*(int *)(in_RDI + 0x44) != -1) {
    in_stack_ffffffffffffff60 = *(uint *)(in_RDI + 0x44);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x44));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM REP token    = %d \'%s\'\n","print_info",
                       (ulong)in_stack_ffffffffffffff60,uVar3);
  }
  if (*(int *)(in_RDI + 0x48) != -1) {
    in_stack_ffffffffffffff5c = *(uint *)(in_RDI + 0x48);
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)*(int *)(in_RDI + 0x48));
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: FIM SEP token    = %d \'%s\'\n","print_info",
                       (ulong)in_stack_ffffffffffffff5c,uVar3);
  }
  local_40 = in_RDI + 0x110;
  local_48._M_node =
       (_Base_ptr)
       ::std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_50._M_node =
       (_Base_ptr)
       ::std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    bVar1 = ::std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    puVar5 = (uint *)::std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)0x53c0fa);
    uVar6 = *puVar5;
    std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::operator[]
              ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
               (in_RDI + 0x90),(long)(int)*puVar5);
    uVar3 = ::std::__cxx11::string::c_str();
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: EOG token        = %d \'%s\'\n","print_info",
                       (ulong)uVar6,uVar3);
    ::std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: max token length = %d\n","print_info",
                     (ulong)*(uint *)(in_RDI + 0xc));
  return;
}

Assistant:

void llama_vocab::impl::print_info() const {
    LLAMA_LOG_INFO("%s: vocab type       = %s\n",     __func__, type_name().c_str());
    LLAMA_LOG_INFO("%s: n_vocab          = %u\n",     __func__, vocab.n_tokens());
    LLAMA_LOG_INFO("%s: n_merges         = %u\n",     __func__, (uint32_t) bpe_ranks.size());

    // special tokens
    if (special_bos_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: BOS token        = %d '%s'\n", __func__, special_bos_id,     id_to_token[special_bos_id].text.c_str() );  }
    if (special_eos_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOS token        = %d '%s'\n", __func__, special_eos_id,     id_to_token[special_eos_id].text.c_str() );  }
    if (special_eot_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOT token        = %d '%s'\n", __func__, special_eot_id,     id_to_token[special_eot_id].text.c_str() );  }
    if (special_eom_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: EOM token        = %d '%s'\n", __func__, special_eom_id,     id_to_token[special_eom_id].text.c_str() );  }
    if (special_unk_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: UNK token        = %d '%s'\n", __func__, special_unk_id,     id_to_token[special_unk_id].text.c_str() );  }
    if (special_sep_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: SEP token        = %d '%s'\n", __func__, special_sep_id,     id_to_token[special_sep_id].text.c_str() );  }
    if (special_pad_id  != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: PAD token        = %d '%s'\n", __func__, special_pad_id,     id_to_token[special_pad_id].text.c_str() );  }
    if (special_mask_id != LLAMA_TOKEN_NULL)    { LLAMA_LOG_INFO( "%s: MASK token       = %d '%s'\n", __func__, special_mask_id,    id_to_token[special_mask_id].text.c_str() ); }

    if (linefeed_id != LLAMA_TOKEN_NULL)        { LLAMA_LOG_INFO( "%s: LF token         = %d '%s'\n", __func__, linefeed_id,        id_to_token[linefeed_id].text.c_str() ); }

    if (special_fim_pre_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM PRE token    = %d '%s'\n", __func__, special_fim_pre_id, id_to_token[special_fim_pre_id].text.c_str() ); }
    if (special_fim_suf_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM SUF token    = %d '%s'\n", __func__, special_fim_suf_id, id_to_token[special_fim_suf_id].text.c_str() ); }
    if (special_fim_mid_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM MID token    = %d '%s'\n", __func__, special_fim_mid_id, id_to_token[special_fim_mid_id].text.c_str() ); }
    if (special_fim_pad_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM PAD token    = %d '%s'\n", __func__, special_fim_pad_id, id_to_token[special_fim_pad_id].text.c_str() ); }
    if (special_fim_rep_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM REP token    = %d '%s'\n", __func__, special_fim_rep_id, id_to_token[special_fim_rep_id].text.c_str() ); }
    if (special_fim_sep_id != LLAMA_TOKEN_NULL) { LLAMA_LOG_INFO( "%s: FIM SEP token    = %d '%s'\n", __func__, special_fim_sep_id, id_to_token[special_fim_sep_id].text.c_str() ); }

    for (const auto & id : special_eog_ids) {
        LLAMA_LOG_INFO( "%s: EOG token        = %d '%s'\n", __func__, id, id_to_token[id].text.c_str() );
    }

    LLAMA_LOG_INFO("%s: max token length = %d\n", __func__, max_token_len);
}